

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlCreateEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  int len;
  xmlEntityPtr entity;
  xmlChar *pxVar1;
  
  entity = (xmlEntityPtr)(*xmlMalloc)(0x90);
  if (entity == (xmlEntityPtr)0x0) {
    return (xmlEntityPtr)0x0;
  }
  memset(entity,0,0x90);
  entity->doc = doc;
  entity->type = XML_ENTITY_DECL;
  entity->etype = type;
  if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
    pxVar1 = xmlStrdup(name);
  }
  else {
    pxVar1 = xmlDictLookup(doc->dict,name,-1);
  }
  entity->name = pxVar1;
  if (pxVar1 == (xmlChar *)0x0) {
LAB_0012d646:
    xmlFreeEntity(entity);
    return (xmlEntityPtr)0x0;
  }
  if (ExternalID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(ExternalID);
    entity->ExternalID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012d646;
  }
  if (SystemID != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(SystemID);
    entity->SystemID = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012d646;
  }
  if (content == (xmlChar *)0x0) {
    entity->length = 0;
    entity->content = (xmlChar *)0x0;
  }
  else {
    len = xmlStrlen(content);
    entity->length = len;
    pxVar1 = xmlStrndup(content,len);
    entity->content = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) goto LAB_0012d646;
  }
  entity->URI = (xmlChar *)0x0;
  entity->orig = (xmlChar *)0x0;
  return entity;
}

Assistant:

static xmlEntityPtr
xmlCreateEntity(xmlDocPtr doc, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
	        const xmlChar *content) {
    xmlEntityPtr ret;

    ret = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlEntity));
    ret->doc = doc;
    ret->type = XML_ENTITY_DECL;

    /*
     * fill the structure.
     */
    ret->etype = (xmlEntityType) type;
    if ((doc == NULL) || (doc->dict == NULL))
	ret->name = xmlStrdup(name);
    else
        ret->name = xmlDictLookup(doc->dict, name, -1);
    if (ret->name == NULL)
        goto error;
    if (ExternalID != NULL) {
        ret->ExternalID = xmlStrdup(ExternalID);
        if (ret->ExternalID == NULL)
            goto error;
    }
    if (SystemID != NULL) {
        ret->SystemID = xmlStrdup(SystemID);
        if (ret->SystemID == NULL)
            goto error;
    }
    if (content != NULL) {
        ret->length = xmlStrlen(content);
	ret->content = xmlStrndup(content, ret->length);
        if (ret->content == NULL)
            goto error;
     } else {
        ret->length = 0;
        ret->content = NULL;
    }
    ret->URI = NULL; /* to be computed by the layer knowing
			the defining entity */
    ret->orig = NULL;

    return(ret);

error:
    xmlFreeEntity(ret);
    return(NULL);
}